

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRelDefines::~IfcRelDefines(IfcRelDefines *this)

{
  undefined8 *puVar1;
  long lVar2;
  void *pvVar3;
  
  lVar2 = *(long *)(*(long *)this + -0x18);
  puVar1 = (undefined8 *)(&this->field_0x0 + lVar2);
  *(undefined ***)(&this->field_0x0 + lVar2) = &PTR__IfcRelDefines_00846b10;
  *(undefined ***)(&this->field_0xc0 + lVar2) = &PTR__IfcRelDefines_00846b88;
  *(undefined ***)(&this->field_0x88 + lVar2) = &PTR__IfcRelDefines_00846b38;
  *(undefined ***)
   ((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>).
           _vptr_ObjectHelper + lVar2) = &PTR__IfcRelDefines_00846b60;
  pvVar3 = *(void **)(&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>).
                       field_0x10 + lVar2);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,puVar1[0x17] - (long)pvVar3);
  }
  *puVar1 = 0x846ca0;
  puVar1[0x18] = 0x846cc8;
  if ((long *)puVar1[0xc] != puVar1 + 0xe) {
    operator_delete((long *)puVar1[0xc],puVar1[0xe] + 1);
  }
  if ((long *)puVar1[7] != puVar1 + 9) {
    operator_delete((long *)puVar1[7],puVar1[9] + 1);
  }
  if ((long *)puVar1[2] != puVar1 + 4) {
    operator_delete((long *)puVar1[2],puVar1[4] + 1);
  }
  operator_delete(puVar1,0xd8);
  return;
}

Assistant:

IfcRelDefines() : Object("IfcRelDefines") {}